

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::emitUrlsSelected(QFileDialogPrivate *this,QList<QUrl> *files)

{
  QObject *pQVar1;
  char cVar2;
  long lVar3;
  QUrl *file;
  long in_FS_OFFSET;
  QString local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)files;
  QMetaObject::activate(pQVar1,&QFileDialog::staticMetaObject,5,&local_58.d);
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  lVar3 = (files->d).size;
  if (lVar3 != 0) {
    lVar3 = lVar3 << 3;
    do {
      cVar2 = QUrl::isLocalFile();
      if (cVar2 != '\0') {
        QUrl::toLocalFile();
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_78);
        QList<QString>::end((QList<QString> *)&local_58);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      lVar3 = lVar3 + -8;
    } while (lVar3 != 0);
  }
  if (local_58.size != 0) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (char16_t *)&local_58;
    QMetaObject::activate(pQVar1,&QFileDialog::staticMetaObject,1,(void **)&local_78);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::emitUrlsSelected(const QList<QUrl> &files)
{
    Q_Q(QFileDialog);
    emit q->urlsSelected(files);
    QStringList localFiles;
    for (const QUrl &file : files)
        if (file.isLocalFile())
            localFiles.append(file.toLocalFile());
    if (!localFiles.isEmpty())
        emit q->filesSelected(localFiles);
}